

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

void KINForcingTerm(KINMem kin_mem,sunrealtype fnormp)

{
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  sunrealtype linmodel_norm;
  sunrealtype eta_safe;
  sunrealtype eta_min;
  sunrealtype eta_max;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_38;
  undefined8 local_28;
  
  local_28 = 0.5;
  if (*(int *)(in_RDI + 0x58) == 1) {
    if (0.0 < *(double *)(in_RDI + 0x278) * *(double *)(in_RDI + 0x278) +
              *(double *)(in_RDI + 0x260) * *(double *)(in_RDI + 0x260) +
              *(double *)(in_RDI + 0x270) * 2.0) {
      local_38 = sqrt(*(double *)(in_RDI + 0x278) * *(double *)(in_RDI + 0x278) +
                      *(double *)(in_RDI + 0x260) * *(double *)(in_RDI + 0x260) +
                      *(double *)(in_RDI + 0x270) * 2.0);
    }
    else {
      local_38 = 0.0;
    }
    local_28 = pow(*(double *)(in_RDI + 0xa8),*(double *)(in_RDI + 0xb8));
    *(double *)(in_RDI + 0xa8) = ABS(in_XMM0_Qa - local_38) / *(double *)(in_RDI + 0x260);
  }
  if (*(int *)(in_RDI + 0x58) == 2) {
    local_28 = *(double *)(in_RDI + 0xb0);
    dVar1 = pow(*(double *)(in_RDI + 0xa8),*(double *)(in_RDI + 0xb8));
    local_28 = local_28 * dVar1;
    dVar1 = *(double *)(in_RDI + 0xb0);
    dVar2 = pow(in_XMM0_Qa / *(double *)(in_RDI + 0x260),*(double *)(in_RDI + 0xb8));
    *(double *)(in_RDI + 0xa8) = dVar1 * dVar2;
  }
  if (local_28 < 0.1) {
    local_28 = 0.0;
  }
  if (*(double *)(in_RDI + 0xa8) <= local_28) {
    local_50 = local_28;
  }
  else {
    local_50 = *(double *)(in_RDI + 0xa8);
  }
  *(double *)(in_RDI + 0xa8) = local_50;
  if (*(double *)(in_RDI + 0xa8) <= 0.0001) {
    local_58 = 0x3f1a36e2eb1c432d;
  }
  else {
    local_58 = *(undefined8 *)(in_RDI + 0xa8);
  }
  *(undefined8 *)(in_RDI + 0xa8) = local_58;
  if (0.9 <= *(double *)(in_RDI + 0xa8)) {
    local_60 = 0x3feccccccccccccd;
  }
  else {
    local_60 = *(undefined8 *)(in_RDI + 0xa8);
  }
  *(undefined8 *)(in_RDI + 0xa8) = local_60;
  return;
}

Assistant:

static void KINForcingTerm(KINMem kin_mem, sunrealtype fnormp)
{
  sunrealtype eta_max, eta_min, eta_safe, linmodel_norm;

  eta_max  = POINT9;
  eta_min  = POINT0001;
  eta_safe = HALF;

  /* choice #1 forcing term */

  if (kin_mem->kin_etaflag == KIN_ETACHOICE1)
  {
    /* compute the norm of f + Jp , scaled L2 norm */

    linmodel_norm = SUNRsqrt((kin_mem->kin_fnorm * kin_mem->kin_fnorm) +
                             (TWO * kin_mem->kin_sFdotJp) +
                             (kin_mem->kin_sJpnorm * kin_mem->kin_sJpnorm));

    /* form the safeguarded for choice #1 */

    eta_safe         = SUNRpowerR(kin_mem->kin_eta, kin_mem->kin_eta_alpha);
    kin_mem->kin_eta = SUNRabs(fnormp - linmodel_norm) / kin_mem->kin_fnorm;
  }

  /* choice #2 forcing term */

  if (kin_mem->kin_etaflag == KIN_ETACHOICE2)
  {
    eta_safe = kin_mem->kin_eta_gamma *
               SUNRpowerR(kin_mem->kin_eta, kin_mem->kin_eta_alpha);

    kin_mem->kin_eta = kin_mem->kin_eta_gamma *
                       SUNRpowerR((fnormp / kin_mem->kin_fnorm),
                                  kin_mem->kin_eta_alpha);
  }

  /* apply safeguards */

  if (eta_safe < POINT1) { eta_safe = ZERO; }
  kin_mem->kin_eta = SUNMAX(kin_mem->kin_eta, eta_safe);
  kin_mem->kin_eta = SUNMAX(kin_mem->kin_eta, eta_min);
  kin_mem->kin_eta = SUNMIN(kin_mem->kin_eta, eta_max);

  return;
}